

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O3

void __thiscall kratos::TestBench::add_port_name(TestBench *this,string *name)

{
  UserException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"Top-level testbench not allowed to have port ",name);
  UserException::UserException(this_00,&local_38);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TestBench::add_port_name(const std::string &name) {
    throw UserException("Top-level testbench not allowed to have port " + name);
}